

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O0

void __thiscall leveldb::MemTableIterator::MemTableIterator(MemTableIterator *this,Table *table)

{
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *in_RSI;
  Iterator *in_RDI;
  
  Iterator::Iterator(in_RDI);
  in_RDI->_vptr_Iterator = (_func_int **)&PTR__MemTableIterator_001603a0;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::Iterator
            ((Iterator *)(in_RDI + 1),in_RSI);
  std::__cxx11::string::string((string *)&in_RDI[1].cleanup_head_.arg1);
  return;
}

Assistant:

explicit MemTableIterator(MemTable::Table* table) : iter_(table) {}